

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tun_linux.c
# Opt level: O2

int ev_linux_opentun(ev_impl *impl,tun_param param)

{
  in_addr iVar1;
  int __fd;
  int iVar2;
  int iVar3;
  char *__s;
  char acStack_58 [16];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  __fd = open("/dev/net/tun",2);
  if (__fd != -1) {
    uStack_40 = 0;
    local_38 = 0;
    local_48 = 1;
    strncpy(acStack_58,param.ifname,0x10);
    iVar2 = ioctl(__fd,0x400454ca,acStack_58);
    iVar1 = param.addr;
    if (iVar2 == -1) {
      __s = "if_settun()";
    }
    else {
      iVar2 = socket(2,2,0);
      __s = "if_setaddr()";
      if (iVar2 != -1) {
        local_48 = 0;
        uStack_40 = 0;
        local_38 = 0;
        strncpy(acStack_58,param.ifname,0x10);
        local_48 = CONCAT62(local_48._2_6_,2);
        local_48 = CONCAT44(iVar1.s_addr,(undefined4)local_48);
        iVar3 = ioctl(iVar2,0x8916,acStack_58);
        close(iVar2);
        iVar1 = param.netmask;
        if (iVar3 != -1) {
          iVar2 = socket(2,2,0);
          __s = "if_setnetmask()";
          if (iVar2 != -1) {
            local_48 = 0;
            uStack_40 = 0;
            local_38 = 0;
            strncpy(acStack_58,param.ifname,0x10);
            local_48 = CONCAT62(local_48._2_6_,2);
            local_48 = CONCAT44(iVar1.s_addr,(undefined4)local_48);
            iVar3 = ioctl(iVar2,0x891c,acStack_58);
            close(iVar2);
            if (iVar3 != -1) {
              iVar2 = socket(2,2,0);
              __s = "if_up()";
              if (iVar2 != -1) {
                local_48 = 0;
                uStack_40 = 0;
                local_38 = 0;
                strncpy(acStack_58,param.ifname,0x10);
                iVar3 = ioctl(iVar2,0x8913,acStack_58);
                if (iVar3 == -1) {
                  close(iVar2);
                }
                else {
                  local_48 = local_48 | 0x41;
                  iVar3 = ioctl(iVar2,0x8914);
                  close(iVar2);
                  if (iVar3 != -1) {
                    return __fd;
                  }
                }
              }
            }
          }
        }
      }
    }
    perror(__s);
    close(__fd);
  }
  return -1;
}

Assistant:

int ev_linux_opentun(struct ev_impl * impl, struct tun_param param)
{
  int ifindex = -1;
  int fd = -1;
  fd = open("/dev/net/tun", O_RDWR);
  if(fd != -1)
  {
    if(!if_settun(fd, param.ifname, &ifindex))
    {
      perror("if_settun()");
      close(fd);
      return -1;
    }
    if(!if_setaddr(param.ifname, param.addr))
    {
      perror("if_setaddr()");
      close(fd);
      return -1;
    }
    if(!if_setnetmask(param.ifname, param.netmask))
    {
      perror("if_setnetmask()");
      close(fd);
      return -1;
    }
    if(!if_up(param.ifname))
    {
      perror("if_up()");
      close(fd);
      return -1;
    }
  }
  return fd;
}